

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<unsigned_int> *
wasm::WATParser::localidx<wasm::WATParser::ParseDefsCtx>
          (Result<unsigned_int> *__return_storage_ptr__,ParseDefsCtx *ctx)

{
  bool bVar1;
  uint *puVar2;
  Name *pNVar3;
  allocator<char> local_89;
  string local_88;
  Err local_68;
  size_t local_48;
  char *local_40;
  undefined1 local_38 [8];
  optional<wasm::Name> id;
  optional<unsigned_int> x;
  ParseDefsCtx *ctx_local;
  
  id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Name>._16_8_ = Lexer::takeU32(&ctx->in);
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional *)
                     &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::Name>._M_engaged);
  if (bVar1) {
    puVar2 = std::optional<unsigned_int>::operator*
                       ((optional<unsigned_int> *)
                        &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::Name>._M_engaged);
    ParseDefsCtx::getLocalFromIdx(__return_storage_ptr__,ctx,*puVar2);
  }
  else {
    Lexer::takeID((optional<wasm::Name> *)local_38,&ctx->in);
    bVar1 = std::optional::operator_cast_to_bool((optional *)local_38);
    if (bVar1) {
      pNVar3 = std::optional<wasm::Name>::operator*((optional<wasm::Name> *)local_38);
      local_48 = (pNVar3->super_IString).str._M_len;
      local_40 = (pNVar3->super_IString).str._M_str;
      ParseDefsCtx::getLocalFromName(__return_storage_ptr__,ctx,(Name)(pNVar3->super_IString).str);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"expected local index or identifier",&local_89);
      Lexer::err(&local_68,&ctx->in,&local_88);
      Result<unsigned_int>::Result(__return_storage_ptr__,&local_68);
      wasm::Err::~Err(&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator(&local_89);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::LocalIdxT> localidx(Ctx& ctx) {
  if (auto x = ctx.in.takeU32()) {
    return ctx.getLocalFromIdx(*x);
  }
  if (auto id = ctx.in.takeID()) {
    return ctx.getLocalFromName(*id);
  }
  return ctx.in.err("expected local index or identifier");
}